

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall
wasm::WasmBinaryWriter::writeDebugLocation(WasmBinaryWriter *this,Expression *curr,Function *func)

{
  pointer *pppEVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  iterator __position;
  mapped_type *pmVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  Expression *local_20;
  Expression *curr_local;
  
  local_20 = curr;
  if (this->sourceMap != (ostream *)0x0) {
    uVar4 = (func->debugLocations)._M_h._M_bucket_count;
    uVar6 = (ulong)curr % uVar4;
    p_Var8 = (func->debugLocations)._M_h._M_buckets[uVar6];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var8->_M_nxt, p_Var9 = p_Var8, (Expression *)p_Var8->_M_nxt[1]._M_nxt != curr)) {
      while (p_Var8 = p_Var7, p_Var7 = p_Var8->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var7[1]._M_nxt % uVar4 != uVar6) ||
           (p_Var9 = p_Var8, (Expression *)p_Var7[1]._M_nxt == curr)) goto LAB_0096ec9b;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_0096ec9b:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var9->_M_nxt;
    }
    if (p_Var7 != (_Hash_node_base *)0x0) {
      writeDebugLocation(this,(DebugLocation *)(p_Var7 + 2));
    }
  }
  if ((func != (Function *)0x0) && ((func->expressionLocations)._M_h._M_element_count != 0)) {
    iVar2 = *(int *)&(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    iVar3 = *(int *)&(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    pmVar5 = std::__detail::
             _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->binaryLocations,&local_20);
    pmVar5->start = iVar2 - iVar3;
    pmVar5->end = 0;
    __position._M_current =
         (this->binaryLocationTrackedExpressionsForFunc).
         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->binaryLocationTrackedExpressionsForFunc).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      _M_realloc_insert<wasm::Expression*const&>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 &this->binaryLocationTrackedExpressionsForFunc,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      pppEVar1 = &(this->binaryLocationTrackedExpressionsForFunc).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDebugLocation(Expression* curr, Function* func) {
  if (sourceMap) {
    auto& debugLocations = func->debugLocations;
    auto iter = debugLocations.find(curr);
    if (iter != debugLocations.end()) {
      writeDebugLocation(iter->second);
    }
  }
  // If this is an instruction in a function, and if the original wasm had
  // binary locations tracked, then track it in the output as well.
  if (func && !func->expressionLocations.empty()) {
    binaryLocations.expressions[curr] =
      BinaryLocations::Span{BinaryLocation(o.size()), 0};
    binaryLocationTrackedExpressionsForFunc.push_back(curr);
  }
}